

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool google::protobuf::internal::MergeFromImpl<false>
               (BoundedZCIS input,MessageLite *msg,ParseFlags parse_flags)

{
  bool bVar1;
  EpsCopyInputStream *this;
  long *in_RDX;
  ParseContext ctx;
  char *ptr;
  ParseFlags in_stack_ffffffffffffff5c;
  MessageLite *in_stack_ffffffffffffff60;
  ParseContext *in_stack_ffffffffffffff68;
  char **in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff7b;
  int in_stack_ffffffffffffff7c;
  ParseContext *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  bool local_1;
  
  io::CodedInputStream::GetDefaultRecursionLimit();
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(bool)in_stack_ffffffffffffff7b,
             in_stack_ffffffffffffff70,(ZeroCopyInputStream **)in_stack_ffffffffffffff68,
             (int *)in_stack_ffffffffffffff60);
  this = (EpsCopyInputStream *)
         (**(code **)(*in_RDX + 0x58))(in_RDX,in_stack_ffffffffffffffd0,&stack0xffffffffffffff60);
  if (this == (EpsCopyInputStream *)0x0) {
    local_1 = false;
  }
  else {
    EpsCopyInputStream::BackUp(this,in_stack_ffffffffffffffc8);
    bVar1 = EpsCopyInputStream::EndedAtLimit((EpsCopyInputStream *)&stack0xffffffffffffff60);
    if (bVar1) {
      local_1 = protobuf::anon_unknown_18::CheckFieldPresence
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffff5c);
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool MergeFromImpl(BoundedZCIS input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = msg->_InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (PROTOBUF_PREDICT_TRUE(ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}